

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_strfmt(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  double n;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  char cVar6;
  int in_EAX;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  undefined8 *puVar16;
  long *plVar17;
  double *pdVar18;
  long lVar19;
  undefined4 in_register_00000034;
  uint uVar20;
  char *pcVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uStack_b0;
  char *end;
  char number_buffer [64];
  
  pcVar15 = (char *)CONCAT44(in_register_00000034,buf_size);
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x1be0,"int nk_strfmt(char *, int, const char *, struct __va_list_tag *)");
  }
  if (pcVar15 == (char *)0x0) {
    return in_EAX;
  }
  uVar11 = 0;
  uVar20 = 0;
  bVar3 = false;
LAB_00132089:
  iVar9 = (int)uVar11;
  cVar6 = *pcVar15;
  if ((cVar6 != '\0') && (iVar9 < 0x100)) {
    lVar22 = (long)iVar9;
    lVar24 = lVar22 << 0x20;
    lVar19 = 0;
    pcVar21 = pcVar15;
    while ((pcVar21 = pcVar21 + 1, cVar6 != '\0' && (cVar6 != '%'))) {
      if (lVar22 + lVar19 == 0x100) {
        iVar9 = 0x100;
        goto LAB_00132ad7;
      }
      buf[lVar19 + lVar22] = cVar6;
      lVar5 = lVar19 + 1;
      lVar19 = lVar19 + 1;
      lVar24 = lVar24 + 0x100000000;
      cVar6 = pcVar15[lVar5];
    }
    if ((cVar6 != '\0') && (uVar23 = lVar22 + lVar19, (long)uVar23 < 0x100)) {
      uVar11 = (uVar11 & 0xffffffff) + lVar19;
      do {
        cVar6 = *pcVar21;
        if (cVar6 == ' ') {
          uVar13 = 4;
          bVar4 = 0;
        }
        else if (cVar6 == '#') {
          uVar13 = 0;
          bVar4 = 0;
        }
        else if (cVar6 == '0') {
          uVar13 = 0x20;
          bVar4 = 0;
        }
        else {
          uVar13 = 0;
          bVar4 = 1;
          if (cVar6 != '-') {
            if (cVar6 != '+') goto LAB_00132155;
            uVar13 = 2;
            bVar4 = 0;
          }
        }
        uVar20 = uVar20 | uVar13;
        bVar3 = (bool)(bVar3 | bVar4);
        pcVar21 = pcVar21 + 1;
      } while( true );
    }
    iVar9 = iVar9 + (int)lVar19;
  }
LAB_00132ad7:
  iVar7 = 0xff;
  if (iVar9 < 0xff) {
    iVar7 = iVar9;
  }
  buf[iVar7] = '\0';
  return iVar7;
LAB_00132155:
  if ((byte)(cVar6 - 0x31U) < 9) {
    iVar7 = nk_strtoi(pcVar21,&end);
    pcVar15 = end;
    if (pcVar21 == end) {
      iVar7 = -1;
    }
  }
  else if (cVar6 == '*') {
    uVar13 = *(uint *)fmt;
    if ((ulong)uVar13 < 0x29) {
      piVar12 = (int *)((ulong)uVar13 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar13 + 8;
    }
    else {
      piVar12 = *(int **)(fmt + 8);
      *(int **)(fmt + 8) = piVar12 + 2;
    }
    iVar7 = *piVar12;
    pcVar15 = pcVar21 + 1;
  }
  else {
    iVar7 = -1;
    pcVar15 = pcVar21;
  }
  cVar6 = *pcVar15;
  if (cVar6 == '.') {
    if (pcVar15[1] == '*') {
      uVar13 = *(uint *)fmt;
      if ((ulong)uVar13 < 0x29) {
        piVar12 = (int *)((ulong)uVar13 + *(long *)(fmt + 0x10));
        *(uint *)fmt = uVar13 + 8;
      }
      else {
        piVar12 = *(int **)(fmt + 8);
        *(int **)(fmt + 8) = piVar12 + 2;
      }
      iVar8 = *piVar12;
      pcVar15 = pcVar15 + 2;
    }
    else {
      pcVar21 = pcVar15 + 1;
      iVar8 = nk_strtoi(pcVar21,&end);
      pcVar15 = end;
      if (end == pcVar21) {
        iVar8 = -1;
      }
    }
    cVar6 = *pcVar15;
  }
  else {
    iVar8 = -1;
  }
  if (cVar6 == 'l') {
    pcVar15 = pcVar15 + 1;
    uStack_b0 = 3;
  }
  else if (cVar6 == 'h') {
    uStack_b0 = (uint)(pcVar15[1] != 'h');
    pcVar21 = pcVar15 + 1;
    if (pcVar15[1] != 'h') {
      pcVar21 = pcVar15;
    }
    pcVar15 = pcVar21 + 1;
  }
  else {
    uStack_b0 = 2;
  }
  cVar6 = *pcVar15;
  switch(cVar6) {
  case 'c':
  case 'd':
  case 'i':
    iVar9 = (*(code *)(&DAT_00157660 + *(int *)(&DAT_00157660 + (ulong)uStack_b0 * 4)))();
    return iVar9;
  case 'f':
    if (iVar8 < 0) {
      iVar8 = 6;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    uVar13 = *(uint *)(fmt + 4);
    if ((ulong)uVar13 < 0xa1) {
      pdVar18 = (double *)((ulong)uVar13 + *(long *)(fmt + 0x10));
      *(uint *)(fmt + 4) = uVar13 + 0x10;
    }
    else {
      pdVar18 = *(double **)(fmt + 8);
      *(double **)(fmt + 8) = pdVar18 + 1;
    }
    if (uStack_b0 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b9b,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    n = *pdVar18;
    nk_dtoa(number_buffer,n);
    iVar9 = nk_strlen(number_buffer);
    for (lVar19 = 0; (cVar6 = number_buffer[lVar19], cVar6 != '\0' && (cVar6 != '.'));
        lVar19 = lVar19 + 1) {
    }
    iVar14 = (int)lVar19 + 1;
    if (cVar6 != '.') {
      iVar14 = 0;
    }
    iVar10 = iVar9 - iVar14;
    if (iVar8 < iVar9 - iVar14) {
      iVar10 = iVar8;
    }
    iVar7 = iVar7 - (iVar10 + iVar14);
    iVar9 = 0;
    if (0 < iVar7) {
      iVar9 = iVar7;
    }
    bVar2 = true;
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar7 = iVar7 + -1;
    if ((uVar20 & 6) == 0) {
      iVar7 = iVar9;
    }
    if (!bVar3) {
      for (; (0 < iVar7 && ((long)uVar23 < 0x100)); uVar23 = uVar23 + 1) {
        buf[uVar23] = (char)(uVar20 >> 5) << 4 | 0x20;
        iVar7 = iVar7 + -1;
      }
      iVar7 = iVar7 + -1;
      uVar11 = uVar23;
    }
    iVar9 = (int)uVar11;
    if (((((uVar20 & 2) != 0) && (0.0 <= n)) && (cVar6 = '+', iVar9 < 0x100)) ||
       ((((uVar20 & 4) != 0 && (0.0 <= n)) && (cVar6 = ' ', iVar9 < 0x100)))) {
      uVar11 = (ulong)(iVar9 + 1);
      buf[iVar9] = cVar6;
    }
    iVar9 = 0;
    pcVar21 = number_buffer;
    bVar1 = false;
    do {
      cVar6 = *pcVar21;
      if (cVar6 == '\0') break;
      iVar9 = (iVar9 + 1) - (uint)!bVar1;
      iVar14 = (int)uVar11;
      if (iVar14 < 0x100) {
        uVar11 = (ulong)(iVar14 + 1);
        buf[iVar14] = cVar6;
      }
      if (cVar6 == '.') {
        bVar1 = bVar2;
      }
      pcVar21 = pcVar21 + 1;
    } while (iVar9 < iVar8);
    do {
      iVar14 = (int)uVar11;
      if (iVar8 <= iVar9) goto code_r0x001328b9;
      if (bVar1) {
LAB_0013289c:
        iVar14 = (int)uVar11;
        bVar1 = bVar2;
        if (iVar14 < 0x100) {
          uVar11 = (ulong)(iVar14 + 1);
          buf[iVar14] = '0';
        }
      }
      else {
        bVar1 = false;
        if (iVar14 < 0x100) {
          uVar11 = (ulong)(iVar14 + 1);
          buf[iVar14] = '.';
          goto LAB_0013289c;
        }
      }
      iVar9 = iVar9 + 1;
    } while( true );
  case 'n':
    uVar13 = *(uint *)fmt;
    if ((ulong)uVar13 < 0x29) {
      plVar17 = (long *)((ulong)uVar13 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar13 + 8;
    }
    else {
      plVar17 = *(long **)(fmt + 8);
      *(long **)(fmt + 8) = plVar17 + 1;
    }
    if (uStack_b0 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b0a,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar8 != -1) {
      __assert_fail("precision == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b0b,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar7 != -1) {
      __assert_fail("width == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b0c,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if ((undefined4 *)*plVar17 != (undefined4 *)0x0) {
      *(undefined4 *)*plVar17 = (int)uVar11;
    }
    break;
  case 'o':
  case 'u':
  case 'x':
code_r0x00132347:
    iVar9 = (*(code *)(&DAT_00157650 + *(int *)(&DAT_00157650 + (ulong)uStack_b0 * 4)))();
    return iVar9;
  case 's':
    uVar13 = *(uint *)fmt;
    if ((ulong)uVar13 < 0x29) {
      puVar16 = (undefined8 *)((ulong)uVar13 + *(long *)(fmt + 0x10));
      *(uint *)fmt = uVar13 + 8;
    }
    else {
      puVar16 = *(undefined8 **)(fmt + 8);
      *(undefined8 **)(fmt + 8) = puVar16 + 1;
    }
    pcVar21 = (char *)*puVar16;
    if (pcVar21 == buf) {
      __assert_fail("str != buf && \"buffer and argument are not allowed to overlap!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b00,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (uStack_b0 != 2) {
      __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b01,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    if (iVar8 != -1) {
      __assert_fail("precision == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b02,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    uVar11 = uVar23;
    if (iVar7 != -1) {
      __assert_fail("width == (-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x1b03,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
    }
    for (; ((pcVar21 != (char *)0x0 && (cVar6 = *pcVar21, cVar6 != '\0')) && ((long)uVar11 < 0x100))
        ; uVar11 = uVar11 + 1) {
      pcVar21 = pcVar21 + 1;
      buf[uVar11] = cVar6;
    }
    break;
  default:
    if (cVar6 == 'X') goto code_r0x00132347;
    if (cVar6 == '%') {
      if (uStack_b0 != 2) {
        __assert_fail("arg_type == NK_ARG_TYPE_DEFAULT",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x1af8,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      if (iVar8 != -1) {
        __assert_fail("precision == (-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x1af9,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      if (iVar7 != -1) {
        __assert_fail("width == (-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x1afa,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)")
        ;
      }
      uVar11 = (ulong)(iVar9 + (int)lVar19 + 1);
      buf[lVar24 >> 0x20] = '%';
      break;
    }
  case 'e':
  case 'g':
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'v':
  case 'w':
    __assert_fail("0 && \"specifier is not supported!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x1bd3,"int nk_vsnprintf(char *, int, const char *, struct __va_list_tag *)");
  }
LAB_00132aa2:
  pcVar15 = pcVar15 + 1;
  goto LAB_00132089;
code_r0x001328b9:
  if (bVar3) {
    for (uVar11 = (ulong)iVar14; (0 < iVar7 && ((long)uVar11 < 0x100)); uVar11 = uVar11 + 1) {
      iVar7 = iVar7 + -1;
      buf[uVar11] = ' ';
    }
  }
  goto LAB_00132aa2;
}

Assistant:

NK_LIB int
nk_strfmt(char *buf, int buf_size, const char *fmt, va_list args)
{
    int result = -1;
    NK_ASSERT(buf);
    NK_ASSERT(buf_size);
    if (!buf || !buf_size || !fmt) return 0;
#ifdef NK_INCLUDE_STANDARD_IO
    result = NK_VSNPRINTF(buf, (nk_size)buf_size, fmt, args);
    result = (result >= buf_size) ? -1: result;
    buf[buf_size-1] = 0;
#else
    result = nk_vsnprintf(buf, buf_size, fmt, args);
#endif
    return result;
}